

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::AggregateMarking::GetAggregateMarkingString_abi_cxx11_
          (KString *__return_storage_ptr__,AggregateMarking *this)

{
  allocator<char> local_19;
  AggregateMarking *local_18;
  AggregateMarking *this_local;
  
  local_18 = this;
  this_local = (AggregateMarking *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,this->m_sAggregateMarkingString,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

KString AggregateMarking::GetAggregateMarkingString() const
{
    return m_sAggregateMarkingString;
}